

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O1

BlockPointer duckdb::BlockPointer::Deserialize(Deserializer *deserializer)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  BlockPointer BVar4;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"block_id");
  BVar4.block_id._0_4_ = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
  BVar4.block_id._4_4_ = extraout_var;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"offset");
  if ((char)iVar1 == '\0') {
    uVar3 = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0x13])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    uVar3 = (ulong)uVar2;
  }
  BVar4.offset = (int)uVar3;
  BVar4.unused_padding = (int)(uVar3 >> 0x20);
  return BVar4;
}

Assistant:

BlockPointer BlockPointer::Deserialize(Deserializer &deserializer) {
	auto block_id = deserializer.ReadProperty<block_id_t>(100, "block_id");
	auto offset = deserializer.ReadPropertyWithDefault<uint32_t>(101, "offset");
	BlockPointer result(block_id, offset);
	return result;
}